

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O0

vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> * __thiscall
libtorrent::entry::get<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
          (entry *this)

{
  bool bVar1;
  vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *pvVar2;
  entry *this_local;
  
  bVar1 = ::std::
          holds_alternative<libtorrent::entry_types::uninitialized_type,long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>
                    (&this->super_variant_type);
  if (bVar1) {
    ::std::
    variant<long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>
    ::emplace<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
              ((variant<long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>
                *)this);
  }
  else {
    bVar1 = ::std::
            holds_alternative<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>
                      (&this->super_variant_type);
    if (!bVar1) {
      anon_unknown_5::throw_error();
    }
  }
  pvVar2 = ::std::
           get<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>
                     (&this->super_variant_type);
  return pvVar2;
}

Assistant:

T& entry::get()
	{
		if (std::holds_alternative<uninitialized_type>(*this)) emplace<T>();
		else if (!std::holds_alternative<T>(*this)) throw_error();
		return std::get<T>(*this);
	}